

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::toString(LatticeImpl *this)

{
  char *pcVar1;
  LatticeImpl *in_RDI;
  LatticeImpl *this_00;
  
  this_00 = in_RDI;
  stream(this);
  pcVar1 = toStringInternal(this_00,(StringBuffer *)in_RDI);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::toString() {
  return toStringInternal(stream());
}